

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWrapper.cpp
# Opt level: O3

bool __thiscall LogWrapper::Write(LogWrapper *this,Location *location,int type,char *format,...)

{
  HANDLE pvVar1;
  char *__s;
  FN_MLogWrite p_Var2;
  char in_AL;
  bool bVar3;
  size_t sVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string str;
  va_list args;
  string local_128;
  undefined8 local_108;
  size_type *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_f8 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &str._M_string_length;
  local_108 = 0x3000000020;
  bVar3 = false;
  local_c8 = in_R8;
  local_c0 = in_R9;
  memset(this->m_buf,0,0x25800);
  dd::Location::ToString_abi_cxx11_(&local_128,location);
  if (local_128._M_string_length < 0x25800) {
    bVar3 = false;
    sprintf(this->m_buf,"%s ",local_128._M_dataplus._M_p);
    vsnprintf(this->m_buf + local_128._M_string_length + 1,0x257ff - local_128._M_string_length,
              format,&local_108);
    this->m_buf[0x257ff] = '\0';
    p_Var2 = s_write;
    if (s_write != (FN_MLogWrite)0x0) {
      pvVar1 = this->m_hLog;
      __s = this->m_buf;
      sVar4 = strlen(__s);
      bVar3 = (*p_Var2)(type,pvVar1,__s,(unsigned_short)sVar4);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool LogWrapper::Write(const dd::Location& location, int type,  const char *format, ... )
{
	va_list args;
	va_start(args, format);
	memset(m_buf, 0, MAX_BUF_SIZE);
	const std::string str = location.ToString();
	if (str.length() >= MAX_BUF_SIZE)
		return false;
	sprintf(m_buf, "%s ", str.c_str());
	vsnprintf(m_buf + str.length() + 1, MAX_BUF_SIZE - str.length() - 1, format, args);
	m_buf[MAX_BUF_SIZE - 1] = '\0';
	va_end(args);

	if(s_write != NULL)
		return	s_write(type, m_hLog, m_buf, strlen(m_buf));
	return false;
}